

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseGenericSelectionExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  GenericSelectionExpressionSyntax *pGVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == Keyword__Generic) {
    pGVar3 = makeNode<psy::C::GenericSelectionExpressionSyntax>(this);
    *expr = &pGVar3->super_ExpressionSyntax;
    IVar4 = consume(this);
    pGVar3->genericKwTkIdx_ = IVar4;
    bVar1 = match(this,OpenParenToken,&pGVar3->openParenTkIdx_);
    if (bVar1) {
      bVar1 = parseExpressionWithPrecedenceAssignment(this,&pGVar3->expr_);
      if (bVar1) {
        bVar1 = match(this,CommaToken,&pGVar3->commaTkIdx_);
        if (bVar1) {
          bVar1 = parseGenericAssociationList(this,&pGVar3->assocs_);
          if (bVar1) {
            bVar1 = matchOrSkipTo(this,CloseParenToken,&pGVar3->closeParenTkIdx_);
            return bVar1;
          }
        }
      }
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x106);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"assert failure: `_Generic\'");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return false;
}

Assistant:

bool Parser::parseGenericSelectionExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword__Generic,
                  return false,
                  "assert failure: `_Generic'");

    auto selExpr = makeNode<GenericSelectionExpressionSyntax>();
    expr = selExpr;
    selExpr->genericKwTkIdx_ = consume();

    return match(SyntaxKind::OpenParenToken, &selExpr->openParenTkIdx_)
            && parseExpressionWithPrecedenceAssignment(selExpr->expr_)
            && match(SyntaxKind::CommaToken, &selExpr->commaTkIdx_)
            && parseGenericAssociationList(selExpr->assocs_)
            && matchOrSkipTo(SyntaxKind::CloseParenToken, &selExpr->closeParenTkIdx_);
}